

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::loadHistory(Cmd *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  istream *piVar3;
  undefined1 local_238 [8];
  string line;
  ifstream file;
  Cmd *this_local;
  
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->history_file_);
  if (bVar1) {
    pbVar2 = std::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->history_file_);
    std::ifstream::ifstream((undefined1 *)((long)&line.field_2 + 8),pbVar2,8);
    std::__cxx11::string::string((string *)local_238);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(line.field_2._M_local_buf + 8),(string *)local_238);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) break;
      addHistoryEntry(this,(string *)local_238);
    }
    std::__cxx11::string::~string((string *)local_238);
    std::ifstream::~ifstream((void *)((long)&line.field_2 + 8));
  }
  return;
}

Assistant:

void loadHistory() {
		if (history_file_) {
			std::ifstream file(*history_file_);
			for (std::string line; std::getline(file, line);) {
				addHistoryEntry(line);
			}
		}
	}